

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O3

Bytes __thiscall
Omega_h::prevent_coarsen_flip_dim<3>(Omega_h *this,Mesh *mesh,LOs *cands2edges,Bytes *cand_codes)

{
  int *piVar1;
  Alloc *pAVar2;
  LO nb;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  Bytes BVar4;
  Read<signed_char> sides_are_exposed;
  Read<signed_char> verts_matter;
  Bytes sides_matter;
  Reals vert_normals;
  Read<signed_char> edges_are_cands;
  Read<signed_char> sides_are_adj;
  Read<signed_char> verts_are_cands;
  Alloc *local_188;
  void *local_180;
  Omega_h *local_178;
  Omega_h *local_170;
  Omega_h *local_168;
  LOs local_160;
  Reals local_150;
  Bytes local_140;
  Bytes local_130;
  Bytes local_120;
  Alloc *local_110;
  void *local_108;
  Alloc *local_100;
  void *local_f8;
  LOs local_f0;
  Bytes local_e0;
  Bytes local_d0;
  Alloc *local_c0;
  void *local_b8;
  Bytes local_b0;
  Bytes local_a0;
  Alloc *local_90;
  void *local_88;
  Read<signed_char> local_80;
  Read<signed_char> local_70;
  Alloc *local_60;
  void *local_58;
  Read<signed_char> local_50;
  Alloc *local_40;
  void *local_38;
  void *pvVar3;
  
  local_f0.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0.write_.shared_alloc_.alloc =
           (Alloc *)((local_f0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f0.write_.shared_alloc_.alloc)->use_count =
           (local_f0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f0.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
  nb = Mesh::nedges(mesh);
  mark_image((Omega_h *)&local_90,&local_f0,nb);
  pAVar2 = local_f0.write_.shared_alloc_.alloc;
  if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_f0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_50.write_.shared_alloc_.alloc = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = local_88;
  mark_down((Omega_h *)&local_40,mesh,1,0,&local_50);
  pAVar2 = local_50.write_.shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_70.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.direct_ptr = local_38;
  local_170 = (Omega_h *)&local_60;
  local_168 = (Omega_h *)&local_40;
  mark_up(local_170,mesh,0,2,&local_70);
  pAVar2 = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  mark_exposed_sides((Omega_h *)&local_188,mesh);
  local_a0.write_.shared_alloc_.alloc = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_58;
  local_b0.write_.shared_alloc_.alloc = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = local_180;
  local_178 = (Omega_h *)&local_100;
  land_each(local_178,&local_a0,&local_b0);
  pAVar2 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_80.write_.shared_alloc_.alloc = local_100;
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
    }
    else {
      local_100->use_count = local_100->use_count + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = local_f8;
  mark_down((Omega_h *)&local_110,mesh,2,0,&local_80);
  pAVar2 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_120.write_.shared_alloc_.alloc = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.write_.shared_alloc_.alloc = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_120.write_.shared_alloc_.direct_ptr = local_180;
  local_d0.write_.shared_alloc_.alloc = local_110;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
    }
    else {
      local_110->use_count = local_110->use_count + 1;
    }
  }
  local_d0.write_.shared_alloc_.direct_ptr = local_108;
  compute_flip_normals_dim<3>((Omega_h *)&local_c0,mesh,&local_120,&local_d0,0.95);
  pAVar2 = local_d0.write_.shared_alloc_.alloc;
  if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_120.write_.shared_alloc_.alloc;
  if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_120.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_130.write_.shared_alloc_.alloc = local_100;
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
    }
    else {
      local_100->use_count = local_100->use_count + 1;
    }
  }
  local_130.write_.shared_alloc_.direct_ptr = local_f8;
  local_140.write_.shared_alloc_.alloc = local_110;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_140.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
    }
    else {
      local_110->use_count = local_110->use_count + 1;
    }
  }
  local_140.write_.shared_alloc_.direct_ptr = local_108;
  local_150.write_.shared_alloc_.alloc = local_c0;
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_150.write_.shared_alloc_.alloc = (Alloc *)(local_c0->size * 8 + 1);
    }
    else {
      local_c0->use_count = local_c0->use_count + 1;
    }
  }
  local_150.write_.shared_alloc_.direct_ptr = local_b8;
  local_160.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
      local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_160.write_.shared_alloc_.alloc =
           (Alloc *)((local_160.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_160.write_.shared_alloc_.alloc)->use_count =
           (local_160.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_160.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
  local_e0.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0.write_.shared_alloc_.alloc =
           (Alloc *)((local_e0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e0.write_.shared_alloc_.alloc)->use_count =
           (local_e0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e0.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
  BVar4 = prevent_coarsen_flip2_dim<3>
                    (this,mesh,&local_130,&local_140,&local_150,&local_160,&local_e0,1e-10);
  pAVar2 = local_e0.write_.shared_alloc_.alloc;
  pvVar3 = BVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  pAVar2 = local_160.write_.shared_alloc_.alloc;
  if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
      local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_160.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  pAVar2 = local_150.write_.shared_alloc_.alloc;
  if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
      local_150.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_150.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_150.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  pAVar2 = local_140.write_.shared_alloc_.alloc;
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_02;
    }
  }
  pAVar2 = local_130.write_.shared_alloc_.alloc;
  if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
      local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_130.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_03;
    }
  }
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    piVar1 = &local_c0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0);
      operator_delete(local_c0,0x48);
      pvVar3 = extraout_RDX_04;
    }
  }
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    piVar1 = &local_110->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_110);
      operator_delete(local_110,0x48);
      pvVar3 = extraout_RDX_05;
    }
  }
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    piVar1 = &local_100->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_100);
      operator_delete(local_100,0x48);
      pvVar3 = extraout_RDX_06;
    }
  }
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    piVar1 = &local_188->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188);
      operator_delete(local_188,0x48);
      pvVar3 = extraout_RDX_07;
    }
  }
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(local_60,0x48);
      pvVar3 = extraout_RDX_08;
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
      pvVar3 = extraout_RDX_09;
    }
  }
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    piVar1 = &local_90->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90);
      operator_delete(local_90,0x48);
      pvVar3 = extraout_RDX_10;
    }
  }
  BVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  BVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar4.write_.shared_alloc_;
}

Assistant:

Bytes prevent_coarsen_flip_dim(
    Mesh* mesh, LOs cands2edges, Bytes cand_codes) {
  auto edges_are_cands = mark_image(cands2edges, mesh->nedges());
  auto verts_are_cands = mark_down(mesh, EDGE, VERT, edges_are_cands);
  auto side_dim = dim - 1;
  auto sides_are_adj = mark_up(mesh, VERT, side_dim, verts_are_cands);
  auto sides_are_exposed = mark_exposed_sides(mesh);
  auto sides_matter = land_each(sides_are_adj, sides_are_exposed);
  auto verts_matter = mark_down(mesh, side_dim, VERT, sides_matter);
  auto vert_normals =
      compute_flip_normals_dim<dim>(mesh, sides_are_exposed, verts_matter);
  auto new_codes = prevent_coarsen_flip2_dim<dim>(
      mesh, sides_matter, verts_matter, vert_normals, cands2edges, cand_codes);
  return new_codes;
}